

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcVertexPoint,_1UL>::Construct
                   (DB *db,LIST *params)

{
  IfcVertexPoint *in;
  
  in = (IfcVertexPoint *)operator_new(0x60);
  *(undefined ***)&in->field_0x48 = &PTR__Object_008d12a0;
  *(undefined8 *)&in->field_0x50 = 0;
  *(char **)&in->field_0x58 = "IfcVertexPoint";
  Assimp::IFC::Schema_2x3::IfcVertex::IfcVertex
            ((IfcVertex *)in,&PTR_construction_vtable_24__00976ed8);
  *(undefined8 *)&(in->super_IfcVertex).field_0x38 = 0;
  *(undefined8 *)&(in->super_IfcVertex).field_0x40 = 0;
  (in->super_IfcVertex).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcVertexPoint_00976e20;
  *(undefined ***)&in->field_0x48 = &PTR__IfcVertexPoint_00976ec0;
  *(undefined ***)
   &(in->super_IfcVertex).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcVertexPoint_00976e48;
  *(undefined ***)
   &(in->super_IfcVertex).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcVertexPoint_00976e70;
  *(undefined ***)&(in->super_IfcVertex).super_IfcTopologicalRepresentationItem.field_0x30 =
       &PTR__IfcVertexPoint_00976e98;
  GenericFill<Assimp::IFC::Schema_2x3::IfcVertexPoint>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcVertex).super_IfcTopologicalRepresentationItem.
                 super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcVertex).super_IfcTopologicalRepresentationItem.
               super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }